

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_neg(secp256k1_ge *r,secp256k1_ge *a)

{
  void *in_RSI;
  void *in_RDI;
  
  memcpy(in_RDI,in_RSI,0x58);
  secp256k1_fe_normalize_weak((secp256k1_fe *)((long)in_RDI + 0x28));
  secp256k1_fe_negate((secp256k1_fe *)((long)in_RDI + 0x28),(secp256k1_fe *)((long)in_RDI + 0x28),1)
  ;
  return;
}

Assistant:

static void secp256k1_ge_neg(secp256k1_ge *r, const secp256k1_ge *a) {
    *r = *a;
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_negate(&r->y, &r->y, 1);
}